

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall RegVmLoweredFunction::CompleteUse(RegVmLoweredFunction *this,VmValue *value)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  VmInstruction *inst;
  uchar *puVar4;
  uint local_24;
  uint i;
  VmInstruction *instruction;
  VmValue *value_local;
  RegVmLoweredFunction *this_local;
  
  inst = getType<VmInstruction>(value);
  if (inst == (VmInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x80,"void RegVmLoweredFunction::CompleteUse(VmValue *)");
  }
  bVar1 = anon_unknown.dwarf_193d67::IsNonLocalValue(inst);
  if ((!bVar1) && (inst->cmd != VM_INST_PHI)) {
    uVar3 = inst->regVmCompletedUsers;
    uVar2 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users);
    if (uVar2 <= uVar3) {
      __assert_fail("instruction->regVmCompletedUsers < instruction->users.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x8a,"void RegVmLoweredFunction::CompleteUse(VmValue *)");
    }
    inst->regVmCompletedUsers = inst->regVmCompletedUsers + 1;
    uVar3 = inst->regVmCompletedUsers;
    uVar2 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users);
    if (uVar3 == uVar2) {
      for (local_24 = 0; uVar3 = SmallArray<unsigned_char,_8U>::size(&inst->regVmRegisters),
          local_24 < uVar3; local_24 = local_24 + 1) {
        puVar4 = SmallArray<unsigned_char,_8U>::operator[](&inst->regVmRegisters,local_24);
        FreeRegister(this,*puVar4);
      }
    }
  }
  return;
}

Assistant:

void RegVmLoweredFunction::CompleteUse(VmValue *value)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	assert(instruction);

	// Can't free instruction register if instruction has uses in multiple blocks, if the register gets used by a different instruction, they might intefere later
	if(IsNonLocalValue(instruction))
		return;

	// Phi instruction shares register ownership for instructions in different blocks, if this registers gets used by a different instruction, they might intefere later
	if(instruction->cmd == VM_INST_PHI)
		return;

	assert(instruction->regVmCompletedUsers < instruction->users.size());

	instruction->regVmCompletedUsers++;

	if(instruction->regVmCompletedUsers == instruction->users.size())
	{
		for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
			FreeRegister(instruction->regVmRegisters[i]);
	}
}